

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3_value_blob(sqlite3_value *pVal)

{
  undefined2 uVar1;
  void *pvVar2;
  char *pcVar3;
  
  if ((pVal->flags & 0x12) != 0) {
    sqlite3VdbeMemExpandBlob(pVal);
    uVar1 = pVal->flags;
    pVal->flags = uVar1 & 0xffed | 0x10;
    if (pVal->n == 0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = pVal->z;
    }
    return pcVar3;
  }
  pvVar2 = sqlite3ValueText(pVal,'\x01');
  return pvVar2;
}

Assistant:

SQLITE_API const void *sqlite3_value_blob(sqlite3_value *pVal){
  Mem *p = (Mem*)pVal;
  if( p->flags & (MEM_Blob|MEM_Str) ){
    sqlite3VdbeMemExpandBlob(p);
    p->flags &= ~MEM_Str;
    p->flags |= MEM_Blob;
    return p->n ? p->z : 0;
  }else{
    return sqlite3_value_text(pVal);
  }
}